

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O2

string * __thiscall
OpenMD::ReplicateVisitor::toString_abi_cxx11_(string *__return_storage_ptr__,ReplicateVisitor *this)

{
  char buffer [65535];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  builtin_strncpy(buffer,"--------------------------------------------------------------\n",0x40);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  snprintf(buffer,0xffff,"Visitor name: %s\n",(this->super_BaseVisitor).visitorName._M_dataplus._M_p
          );
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  memcpy(buffer,"Visitor Description: replicate the atoms in different direction\n",0x41);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  snprintf(buffer,0xffff,"repeatX = %d:\n",
           (ulong)(uint)(this->replicateOpt).super_Vector<int,_3U>.data_[0]);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  snprintf(buffer,0xffff,"repeatY = %d:\n",
           (ulong)(uint)(this->replicateOpt).super_Vector<int,_3U>.data_[1]);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  snprintf(buffer,0xffff,"repeatZ = %d:\n",
           (ulong)(uint)(this->replicateOpt).super_Vector<int,_3U>.data_[2]);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  builtin_strncpy(buffer,"--------------------------------------------------------------\n",0x40);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

const std::string ReplicateVisitor::toString() {
    char buffer[65535];
    std::string result;

    snprintf(
        buffer, 65535,
        "--------------------------------------------------------------\n");
    result += buffer;

    snprintf(buffer, 65535, "Visitor name: %s\n", visitorName.c_str());
    result += buffer;

    snprintf(
        buffer, 65535,
        "Visitor Description: replicate the atoms in different direction\n");
    result += buffer;

    // print the replicate direction
    snprintf(buffer, 65535, "repeatX = %d:\n", replicateOpt[0]);
    result += buffer;

    snprintf(buffer, 65535, "repeatY = %d:\n", replicateOpt[1]);
    result += buffer;

    snprintf(buffer, 65535, "repeatZ = %d:\n", replicateOpt[2]);
    result += buffer;

    snprintf(
        buffer, 65535,
        "--------------------------------------------------------------\n");
    result += buffer;

    return result;
  }